

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deal.cpp
# Opt level: O1

void __thiscall Deal::bidding(Deal *this)

{
  Player *pPVar1;
  uint uVar2;
  int iVar3;
  ostream *poVar4;
  undefined4 extraout_var;
  Contract *pCVar5;
  int iVar6;
  char cVar7;
  int iVar8;
  int iVar9;
  Cursor local_44;
  Erase local_38;
  Contract *c;
  
  iVar9 = this->_contractor;
  if (iVar9 == -1) {
    iVar9 = this->_dealer;
  }
  iVar6 = 0;
  AdvancedConsole::Erase::Erase((Erase *)&local_44,AC_ALL,AC_SCREEN);
  AdvancedConsole::operator<<((ostream *)&std::cout,(Erase *)&local_44);
  AdvancedConsole::Cursor::Cursor(&local_44,0,0,AC_ABSOLUTE);
  poVar4 = AdvancedConsole::operator<<((ostream *)&std::cout,&local_44);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Proposes:",9);
  do {
    while( true ) {
      uVar2 = iVar9 + 4;
      if (-1 < (int)(iVar9 + 1U)) {
        uVar2 = iVar9 + 1U;
      }
      if ((2 < iVar6) && ((iVar6 != 3 || (this->_contract != (Contract *)0x0)))) {
        this->_state = Playing;
        makeMemento(this);
        return;
      }
      iVar8 = iVar9 - (uVar2 & 0xfffffffc);
      iVar9 = iVar8 + 1;
      AdvancedConsole::Cursor::Cursor(&local_44,6,0,AC_ABSOLUTE);
      poVar4 = AdvancedConsole::operator<<((ostream *)&std::cout,&local_44);
      AdvancedConsole::Erase::Erase(&local_38,AC_ALL,AC_LINE);
      poVar4 = AdvancedConsole::operator<<(poVar4,&local_38);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Player: ",8);
      poVar4 = operator<<(poVar4,(this->_players)._M_elems[iVar9]);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      pPVar1 = (this->_players)._M_elems[iVar9];
      iVar3 = (*(pPVar1->super_Serializable)._vptr_Serializable[1])(pPVar1,this->_contract);
      c = (Contract *)CONCAT44(extraout_var,iVar3);
      AdvancedConsole::Cursor::Cursor(&local_44,iVar8 + 3,0,AC_ABSOLUTE);
      poVar4 = AdvancedConsole::operator<<((ostream *)&std::cout,&local_44);
      AdvancedConsole::Erase::Erase(&local_38,AC_ALL,AC_LINE);
      AdvancedConsole::operator<<(poVar4,&local_38);
      pCVar5 = Contract::Pass();
      if (c != pCVar5) break;
      poVar4 = operator<<((ostream *)&std::cout,(this->_players)._M_elems[iVar9]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," passed",7);
      cVar7 = (char)poVar4;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + cVar7);
LAB_0010d5e7:
      std::ostream::put(cVar7);
      std::ostream::flush();
      iVar6 = iVar6 + 1;
    }
    if ((this->_contract != (Contract *)0x0) && (c <= this->_contract)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Error, contract lower than the previous one",0x2b);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
      cVar7 = '\0';
      goto LAB_0010d5e7;
    }
    poVar4 = operator<<((ostream *)&std::cout,(this->_players)._M_elems[iVar9]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," proposed ",10);
    poVar4 = operator<<(poVar4,c);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    this->_contract = c;
    this->_contractor = iVar9;
    makeMemento(this);
    iVar6 = 0;
  } while( true );
}

Assistant:

void Deal::bidding() {
    int speaker = ((_contractor == -1 ? _dealer : _contractor) + 1) % 4;
    int nbrOfPass = 0;
    Contract *tmp_c;
    cout << AdvancedConsole::Erase();
    cout << AdvancedConsole::Cursor(0, 0) << "Proposes:";
    while ((nbrOfPass < 3) || (nbrOfPass == 3 && _contract == nullptr)) {
        cout << AdvancedConsole::Cursor(6, 0)
             << AdvancedConsole::Erase(AdvancedConsole::AC_ALL, AdvancedConsole::AC_LINE)
             << "Player: " << *_players[speaker] << endl;
        tmp_c = _players[speaker]->proposeContract(_contract);


        cout << AdvancedConsole::Cursor(speaker + 2, 0)
             << AdvancedConsole::Erase(AdvancedConsole::AC_ALL, AdvancedConsole::AC_LINE);
        if (tmp_c == Contract::Pass()) {
            cout << *_players[speaker] << " passed" << endl;
            nbrOfPass++;
        } else if (_contract == nullptr || tmp_c > _contract) {
            cout << *_players[speaker] << " proposed " << *tmp_c << endl;
            nbrOfPass = 0;
            _contract = tmp_c;
            _contractor = speaker;
            makeMemento();
        } else {
            cout << "Error, contract lower than the previous one" << endl;
            nbrOfPass++;
        }
        speaker = (speaker + 1) % 4;
    }

    _state = State::Playing;
    makeMemento();
}